

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

void __thiscall Sudoku::skryjNa30(Sudoku *this)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint auStack_858 [413];
  Sudoku local_1e4;
  
  do {
    iVar11 = 0;
    memset(&local_1e4,0,0x1bc);
    do {
      do {
        iVar3 = rand();
        iVar3 = iVar3 % 0x51;
        bVar2 = *(byte *)(local_1e4.s.pole + iVar3);
      } while ((bVar2 & 0xf) != 0);
      bVar4 = *(byte *)((this->s).pole + iVar3) & 0xf;
      *(byte *)(local_1e4.s.pole + iVar3) = bVar2 | bVar4 | 0x10;
      cVar6 = (char)iVar3;
      uVar9 = cVar6 * 0x39;
      cVar8 = ((char)(uVar9 >> 8) >> 1) + (char)((uVar9 & 0xffff) >> 0xf);
      cVar7 = cVar6 + cVar8 * -9;
      uVar10 = 1 << bVar4;
      puVar1 = local_1e4.s.radky + cVar8;
      *puVar1 = *puVar1 | uVar10;
      puVar1 = local_1e4.s.sloupce + cVar7;
      *puVar1 = *puVar1 | uVar10;
      uVar5 = cVar7 * 0x56;
      uVar9 = cVar6 * 0x13;
      puVar1 = local_1e4.s.ctverce[(char)((char)((uVar5 & 0xffff) >> 0xf) + (char)(uVar5 >> 8))] +
               (char)((char)((uint)(int)(short)uVar9 >> 9) + (char)((uVar9 & 0xffff) >> 0xf));
      *puVar1 = *puVar1 | uVar10;
      iVar11 = iVar11 + 1;
    } while (iVar11 != 0x1e);
    local_1e4.s.doplnenych = 0x1e;
    do {
      iVar11 = krok(&local_1e4);
    } while (iVar11 != 0);
  } while (local_1e4.s.doplnenych != 0x51);
  memcpy(this,&local_1e4,0x1bc);
  return;
}

Assistant:

void Sudoku::skryjNa30()
{
  Sudoku temp(-1); // vytvorime prazdne sudoku
  int x,y;
  do
  {
    temp.initPole(); // uplne vyprazdnime docasne sudoku
    // hledame 30 poli
    for (int n=0; n<30; n++)
    {
      int i;
      do
      {
        i = rand() % 81;
      } while (temp.s.pole[i].zapsane); // najdeme v docasnem sudoku nahodne prazdne policko
      // preneseme z naseho sudoku cislo do docasneho
      temp.s.pole[i].zapsane = s.pole[i].zapsane;
      temp.s.pole[i].pevne = true;// generujeme, vse pevne
      x = i % 9;
      y = i / 9;
      // zakazeme pouzit v radcich/sloupcich/ctvercich vyplnene pole
      temp.s.radky[y] |= (1 << s.pole[i].zapsane);
      temp.s.sloupce[x] |= (1 << s.pole[i].zapsane);
      temp.s.ctverce[x/3][y/3] |= (1 << s.pole[i].zapsane);
    }
    temp.s.doplnenych = 30; // vyplnili jsme 30 policek
  } while (!temp.jednoducheReseni()); // dokud se neda sudoku vyresit jednoduchym doplnovanim
  s = temp.s;// preneseni stavu z docasneho sudoku
}